

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveShImportObj(Parser *parser,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  DirectiveObjImport *pDVar4;
  undefined4 in_register_00000034;
  Identifier ctorName;
  vector<Expression,_std::allocator<Expression>_> list;
  StringLiteral inputName;
  Identifier local_98;
  vector<Expression,_std::allocator<Expression>_> local_78;
  StringLiteral local_60;
  path local_40;
  
  local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&local_78,1,2);
  if (bVar3) {
    paVar1 = &local_60._value.field_2;
    local_60._value._M_string_length = 0;
    local_60._value.field_2._M_local_buf[0] = '\0';
    local_60._value._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = Expression::evaluateString
                      (local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_60,true);
    if (bVar3) {
      if ((long)local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_start == 0x30) {
        paVar2 = &local_98._name.field_2;
        local_98._name._M_string_length = 0;
        local_98._name.field_2._M_local_buf[0] = '\0';
        local_98._name._M_dataplus._M_p = (pointer)paVar2;
        bVar3 = Expression::evaluateIdentifier
                          (local_78.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1,&local_98);
        if (bVar3) {
          StringLiteral::path(&local_40,&local_60);
          pDVar4 = (DirectiveObjImport *)operator_new(0x78);
          DirectiveObjImport::DirectiveObjImport(pDVar4,&local_40,&local_98);
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pDVar4;
          ghc::filesystem::path::~path(&local_40);
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._name._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._name._M_dataplus._M_p,
                          CONCAT71(local_98._name.field_2._M_allocated_capacity._1_7_,
                                   local_98._name.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        StringLiteral::path((path *)&local_98,&local_60);
        pDVar4 = (DirectiveObjImport *)operator_new(0x78);
        DirectiveObjImport::DirectiveObjImport(pDVar4,(path *)&local_98);
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pDVar4;
        ghc::filesystem::path::~path((path *)&local_98);
      }
    }
    else {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._value._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._value._M_dataplus._M_p,
                      CONCAT71(local_60._value.field_2._M_allocated_capacity._1_7_,
                               local_60._value.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_78);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveShImportObj(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	return std::make_unique<DirectiveObjImport>(inputName.path());
}